

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rolledbitpacking.h
# Opt level: O1

void FastPForLib::__pack<9u,true>(uint32_t *in,uint32_t *out)

{
  uint32_t k;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  
  k = 0;
  uVar1 = 0;
  do {
    if (uVar1 == 0) {
      uVar1 = *in;
      in = in + 1;
      *out = uVar1 & 0x1ff;
      uVar1 = 9;
    }
    if (uVar1 < 0x18) {
      uVar3 = *out;
      uVar2 = uVar1;
      do {
        uVar1 = *in;
        in = in + 1;
        uVar3 = uVar3 | (uVar1 & 0x1ff) << (uVar2 & 0x1f);
        *out = uVar3;
        uVar1 = uVar2 + 9;
        bVar4 = uVar2 < 0xf;
        uVar2 = uVar1;
      } while (bVar4);
    }
    uVar3 = 0;
    if (uVar1 < 0x20) {
      *out = *out | (*in & 0x1ff) << (uVar1 & 0x1f);
      uVar3 = *in;
      in = in + 1;
      out[1] = (uVar3 & 0x1ff) >> ((byte)-(char)uVar1 & 0x1f);
      uVar3 = uVar1 - 0x17;
    }
    uVar1 = uVar3;
    k = k + 1;
    out = out + 1;
  } while (k != 9);
  return;
}

Assistant:

void __pack(const uint32_t *__restrict__ in, uint32_t *__restrict__ out) {
  uint32_t inwordpointer = 0; // indicates where we are reading
  // k iterates over the output
  for (uint32_t k = 0; k < bit; ++k, ++out) {
    if (inwordpointer == 0) {
      *out = __bitmask<bit, mask>(*in++);
      inwordpointer += bit;
    }
    // compiler (gcc 4.6.3) had trouble with this, cannot unroll
    // while(inwordpointer <= 32-bit) {
    //    *out |= __bitmask<bit, mask> (*in++) << inwordpointer;
    //    inwordpointer += bit;
    //}
    // attempt (grungy!)

    // loop cannot iterate much
    for (uint32_t i = 0; i < 1 + 32 / bit; ++i) {
      if (inwordpointer > 32 - bit)
        break;
      *out |= __bitmask<bit, mask>(*in++) << inwordpointer;
      inwordpointer += bit;
    }
    // end ofk grunge

    if (inwordpointer < 32) {
      *out |= __bitmask<bit, mask>(*in) << inwordpointer;
      inwordpointer += bit - 32;
      *(out + 1) = __bitmask<bit, mask>(*in++) >> (bit - inwordpointer);

    } else
      // inwordpointer==32
      inwordpointer = 0;
  }
}